

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FactoredQLastTimeStepOrQBG.cpp
# Opt level: O2

void __thiscall
FactoredQLastTimeStepOrQBG::FactoredQLastTimeStepOrQBG
          (FactoredQLastTimeStepOrQBG *this,PlanningUnitFactoredDecPOMDPDiscrete *puf)

{
  QBG *this_00;
  
  (this->super_FactoredQLastTimeStepOrElse).super_FactoredQFunctionStateJAOHInterface.
  super_QFunctionJAOHInterface =
       (QFunctionJAOHInterface)&PTR__QFunctionForDecPOMDPInterface_005db8d0;
  QFunctionForFactoredDecPOMDPInterface::QFunctionForFactoredDecPOMDPInterface
            ((QFunctionForFactoredDecPOMDPInterface *)
             &(this->super_FactoredQLastTimeStepOrElse).super_QFunctionForFactoredDecPOMDP,
             &PTR_construction_vtable_152__005db1d8);
  FactoredQLastTimeStepOrElse::FactoredQLastTimeStepOrElse
            (&this->super_FactoredQLastTimeStepOrElse,&PTR_construction_vtable_136__005db130,puf);
  (this->super_FactoredQLastTimeStepOrElse).super_FactoredQFunctionStateJAOHInterface.
  super_QFunctionJAOHInterface = (QFunctionJAOHInterface)0x5daf60;
  *(undefined8 *)&(this->super_FactoredQLastTimeStepOrElse).super_QFunctionForFactoredDecPOMDP =
       0x5db0a8;
  this_00 = (QBG *)operator_new(0x60);
  QBG::QBG(this_00,&puf->super_PlanningUnitDecPOMDPDiscrete);
  this->_m_QBG = this_00;
  this->_m_initialized = false;
  return;
}

Assistant:

FactoredQLastTimeStepOrQBG::
FactoredQLastTimeStepOrQBG(const PlanningUnitFactoredDecPOMDPDiscrete* puf) :
    FactoredQLastTimeStepOrElse(puf)
{
    _m_QBG=new QBG(puf);
    _m_initialized = false;
}